

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O3

shared_ptr<mnf::Manifold> __thiscall mnf::Manifold::copyManifold(Manifold *this,Manifold *m)

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mnf::Manifold> *copy;
  shared_ptr<mnf::Manifold> sVar2;
  
  m->lock_ = true;
  (*m->_vptr_Manifold[0xc])();
  pp_Var1 = this->_vptr_Manifold;
  pp_Var1[2] = (_func_int *)m->instanceId_;
  *(undefined1 *)(pp_Var1 + 10) = 1;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mnf::Manifold>)
         sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> Manifold::copyManifold(const Manifold& m)
{
  std::shared_ptr<Manifold> copy = m.getNewCopy();
  return copy;
}